

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

string * __thiscall
t_st_generator::function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_st_generator *this,t_function *tfunction)

{
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)&tfunction->name_);
  t_generator::camelcase(&local_60,(t_generator *)this,&local_40);
  argument_list_abi_cxx11_(&local_a0,this,tfunction->arglist_);
  t_generator::capitalize(&local_80,(t_generator *)this,&local_a0);
  std::operator+(__return_storage_ptr__,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::function_signature(t_function* tfunction) {
  return camelcase(tfunction->get_name()) + capitalize(argument_list(tfunction->get_arglist()));
}